

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O2

void init_option_defaults(void)

{
  showHelp = '\0';
  quiet = '\0';
  allowConcatenatedArgs = '\0';
  normalFlag = '\0';
  requiredArgFlag = '\0';
  stringVal = (dropt_char *)0x0;
  hiddenFlag = '\0';
  stringVal2 = (dropt_char *)0x0;
  intVal = 0;
  optionalUInt.is_set = false;
  optionalUInt.value = 10;
  ipAddress = 0;
  return;
}

Assistant:

static void
init_option_defaults(void)
{
    showHelp = false;
    quiet = false;
    allowConcatenatedArgs = false;
    normalFlag = false;
    requiredArgFlag = false;
    hiddenFlag = false;
    stringVal = NULL;
    stringVal2 = NULL;
    intVal = 0;

    optionalUInt.is_set = false;
    optionalUInt.value = 10;

    ipAddress = 0;
}